

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEPlanet.cpp
# Opt level: O0

double __thiscall CEPlanet::EarthDist_AU(CEPlanet *this,CEDate *date)

{
  double dVar1;
  double dVar2;
  double dVar3;
  CEPlanetAlgo CVar4;
  reference pvVar5;
  long *in_RSI;
  CEPlanet *in_RDI;
  double dVar6;
  double dVar7;
  vector<double,_std::allocator<double>_> *this_00;
  CEPlanet *this_01;
  double z;
  double y;
  double x;
  vector<double,_std::allocator<double>_> pos;
  CEPlanet earth;
  double *in_stack_fffffffffffffe08;
  CEPlanet *in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe58;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe60;
  vector<double,_std::allocator<double>_> local_188;
  undefined8 local_170;
  CEPlanetAlgo local_154;
  long *local_10;
  
  local_10 = in_RSI;
  Earth();
  CVar4 = Algorithm(in_RDI);
  local_154 = CVar4;
  SetAlgorithm(in_stack_fffffffffffffe10,(CEPlanetAlgo *)in_stack_fffffffffffffe08);
  local_170 = (**(code **)(*local_10 + 0x20))();
  UpdatePosition(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffe60,
             (vector<double,_std::allocator<double>_> *)CONCAT44(CVar4,in_stack_fffffffffffffe58));
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_188,0);
  dVar1 = *pvVar5;
  dVar6 = GetXICRS((CEPlanet *)0x140ddf);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_188,1);
  dVar2 = *pvVar5;
  dVar7 = GetYICRS((CEPlanet *)0x140e23);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_188,2);
  dVar3 = *pvVar5;
  this_00 = (vector<double,_std::allocator<double>_> *)GetZICRS((CEPlanet *)0x140e67);
  this_01 = (CEPlanet *)
            sqrt((dVar3 - (double)this_00) * (dVar3 - (double)this_00) +
                 (dVar1 - dVar6) * (dVar1 - dVar6) + (dVar2 - dVar7) * (dVar2 - dVar7));
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  ~CEPlanet(this_01);
  return (double)this_01;
}

Assistant:

double CEPlanet::EarthDist_AU(const CEDate& date)
{
    // Compute the position of the earth relative to the planet to account
    // for the time delay of the planet
    CEPlanet earth = CEPlanet::Earth();
    earth.SetAlgorithm(Algorithm());
    earth.UpdatePosition(date.JD());

    std::vector<double> pos = pos_icrs_;
    double x = pos[0] - earth.GetXICRS();
    double y = pos[1] - earth.GetYICRS();
    double z = pos[2] - earth.GetZICRS();

    // Compute the light travel time from the planet to Earth in days
    return std::sqrt(x*x + y*y + z*z);
}